

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O1

void __thiscall rengine::AnimationManager::tick(AnimationManager *this)

{
  list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  *this_00;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Node *p_Var3;
  iterator iVar4;
  _List_node_base *p_Var5;
  
  p_Var2 = (_List_node_base *)(this->m_nextTick).__d.__r;
  iVar4._M_node =
       (this->m_scheduledAnimations).
       super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  (this->m_nextTick).__d.__r = (rep)(p_Var2 + 1000000);
  this_00 = &this->m_scheduledAnimations;
  if (iVar4._M_node != (_List_node_base *)this_00) {
    do {
      if (((ulong)iVar4._M_node[1]._M_prev[2]._M_next & 1) != 0) {
        __assert_fail("!si->animation->isRunning()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                      ,0x17e,"void rengine::AnimationManager::tick()");
      }
      if ((((ManagedAnimation *)(iVar4._M_node + 1))->start).__d.__r < (long)p_Var2) {
        iVar4._M_node[1]._M_next = p_Var2;
        p_Var5 = iVar4._M_node[1]._M_prev + 2;
        *(byte *)&p_Var5->_M_next = *(byte *)&p_Var5->_M_next | 1;
        Signal<>::emit(&AbstractAnimation::onStarted,(SignalEmitter *)iVar4._M_node[1]._M_prev);
        p_Var3 = std::__cxx11::
                 list<rengine::AnimationManager::ManagedAnimation,std::allocator<rengine::AnimationManager::ManagedAnimation>>
                 ::_M_create_node<rengine::AnimationManager::ManagedAnimation_const&>
                           ((list<rengine::AnimationManager::ManagedAnimation,std::allocator<rengine::AnimationManager::ManagedAnimation>>
                             *)&this->m_runningAnimations,(ManagedAnimation *)(iVar4._M_node + 1));
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(this->m_runningAnimations).
                  super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var5 = (iVar4._M_node)->_M_next;
        std::__cxx11::
        list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
        ::_M_erase(this_00,iVar4);
      }
      else {
        p_Var5 = (iVar4._M_node)->_M_next;
      }
      iVar4._M_node = p_Var5;
    } while (p_Var5 != (_List_node_base *)this_00);
  }
  iVar4._M_node =
       (this->m_runningAnimations).
       super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while (iVar4._M_node != (_List_node_base *)&this->m_runningAnimations) {
    if (((ulong)iVar4._M_node[1]._M_prev[2]._M_next & 1) == 0) {
      __assert_fail("ri->animation->isRunning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                    ,0x18d,"void rengine::AnimationManager::tick()");
    }
    (*(code *)(iVar4._M_node[1]._M_prev)->_M_next[1]._M_next)
              ((double)((long)p_Var2 - (long)iVar4._M_node[1]._M_next) / 1000000000.0);
    if (((ulong)iVar4._M_node[1]._M_prev[2]._M_next & 1) == 0) {
      Signal<>::emit(&AbstractAnimation::onCompleted,(SignalEmitter *)iVar4._M_node[1]._M_prev);
      p_Var5 = (iVar4._M_node)->_M_next;
      std::__cxx11::
      list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
      ::_M_erase(&this->m_runningAnimations,iVar4);
      iVar4._M_node = p_Var5;
    }
    else {
      iVar4._M_node = (iVar4._M_node)->_M_next;
    }
  }
  if (((this->m_runningAnimations).
       super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ._M_impl._M_node._M_size == 0 &&
       (this->m_scheduledAnimations).
       super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ._M_impl._M_node._M_size == 0) && (this->m_running != false)) {
    this->m_running = false;
    Signal<>::emit(&onRunningChanged,&this->super_SignalEmitter);
    return;
  }
  return;
}

Assistant:

inline void AnimationManager::tick()
{
    // alternatively:
    // time_point now = clock::now();
    time_point now = m_nextTick;
    m_nextTick += std::chrono::milliseconds(16);

    // std::cout << "AnimationManager::tick: scheduled=" << m_scheduledAnimations.size()
    //           << ", running=" << m_runningAnimations.size() << std::endl;

    // Start pending animations if we've passed beyond its starting point.
    // ### TODO: these should probably be sorted so animations start in the right order
    auto si = m_scheduledAnimations.begin();
    while (si != m_scheduledAnimations.end()) {
        assert(!si->animation->isRunning());
        if (si->start < now) {
            // Make sure we start at t=0
            si->start = now;
            si->animation->setRunning(true);
            AbstractAnimation::onStarted.emit(si->animation.get());
            m_runningAnimations.push_back(*si);
            si = m_scheduledAnimations.erase(si);
        } else {
            ++si;
        }
    }

    auto ri = m_runningAnimations.begin();
    while (ri != m_runningAnimations.end()) {
        assert(ri->animation->isRunning());
        std::chrono::duration<double> animTime = now - ri->start;
        ri->animation->tick(animTime.count());
        if (!ri->animation->isRunning()) {
            AbstractAnimation::onCompleted.emit(ri->animation.get());
            ri = m_runningAnimations.erase(ri);
        } else {
            ++ri;
        }
    }

    if (m_scheduledAnimations.size() == 0 && m_runningAnimations.size() == 0)
        setRunning(false);
}